

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O3

int __thiscall
ncnn::DarknetActivation::forward_inplace(DarknetActivation *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  
  switch(this->activate_type) {
  case 2:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar5 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
            *(uint *)((long)pvVar5 + uVar7 * 4) =
                 ~-(uint)(0.0 < fVar8) & (uint)(fVar8 * 0.01) | (uint)fVar8 & -(uint)(0.0 < fVar8);
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
    break;
  case 4:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pvVar5 = bottom_top_blob->data;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
            fVar9 = fVar8;
            if (fVar8 <= 0.0) {
              fVar9 = 0.0;
            }
            *(float *)((long)pvVar5 + uVar7 * 4) = fVar8 * 0.1 + fVar9;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
    break;
  case 6:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pvVar5 = bottom_top_blob->data;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
            if (-4.0 <= fVar8) {
              if (fVar8 <= 4.0) {
                fVar8 = fVar8 * 0.125 + 0.5;
              }
              else {
                fVar8 = (fVar8 + -4.0) * 0.01 + 1.0;
              }
            }
            else {
              fVar8 = (fVar8 + 4.0) * 0.01;
            }
            *(float *)((long)pvVar5 + uVar7 * 4) = fVar8;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
    break;
  case 9:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar5 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = expf(-*(float *)((long)pvVar5 + uVar7 * 4));
            *(float *)((long)pvVar5 + uVar7 * 4) = 2.0 / (fVar8 + 1.0) + -1.0;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
    break;
  case 10:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar5 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
            fVar9 = floorf(fVar8);
            if (((int)fVar9 & 1U) == 0) {
              dVar10 = floor((double)fVar8 * 0.5);
            }
            else {
              dVar10 = floor((double)fVar8 * 0.5);
              dVar10 = dVar10 + (double)(fVar8 - (float)(int)fVar9);
            }
            *(float *)((long)pvVar5 + uVar7 * 4) = (float)dVar10;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
    break;
  case 0xb:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pvVar5 = bottom_top_blob->data;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
            if (1.0 <= fVar8) {
              fVar8 = 1.0;
            }
            if (fVar8 <= -1.0) {
              fVar8 = -1.0;
            }
            *(float *)((long)pvVar5 + uVar7 * 4) = fVar8;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
    break;
  case 0xc:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar5 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      lVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            fVar8 = *(float *)((long)pvVar5 + uVar7 * 4);
            if (0.0 <= fVar8) {
              if (1.0 < fVar8) {
                fVar8 = (fVar8 + -1.0) * 0.001 + 1.0;
              }
            }
            else {
              fVar8 = fVar8 * 0.001;
            }
            *(float *)((long)pvVar5 + uVar7 * 4) = fVar8;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        lVar6 = lVar6 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
      } while (lVar6 != iVar1);
    }
  }
  return 0;
}

Assistant:

int DarknetActivation::forward_inplace(Mat &bottom_top_blob,
                                       const Option &opt) const
{
  if (activate_type == Activate_LINEAR)
    return 0;
  if (activate_type == Activate_RELIE)
    return activate_op_inplace< activate_op_relie<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_RAMP)
    return activate_op_inplace< activate_op_ramp<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_LOGGY)
    return activate_op_inplace <activate_op_loggy<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_PLSE)
    return activate_op_inplace< activate_op_plse<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_STAIR)
    return activate_op_inplace< activate_op_stair<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_HARDTAN)
    return activate_op_inplace< activate_op_hardtan<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_LHTAN)
    return activate_op_inplace< activate_op_lhtan<float> >(bottom_top_blob, opt);

  return 0;
}